

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::sequence_type<std::__cxx11::string>
               (string *param_1,Module *m)

{
  allocator<char> local_71;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_70;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int_char_ptr
  *local_60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  local_60 = detail::insert_at<std::__cxx11::string>;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(std::__cxx11::string&,int,char_const&),void(*)(std::__cxx11::string&,int,char_const&)>,void(*)(std::__cxx11::string&,int,char_const&)>
            ((chaiscript *)&local_58,&local_60);
  sequence_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::{lambda()#1}
  ::operator()[abi_cxx11_(&local_28,&local_71);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_58,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_60 = detail::erase_at<std::__cxx11::string>;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(std::__cxx11::string&,int),void(*)(std::__cxx11::string&,int)>,void(*)(std::__cxx11::string&,int)>
            ((chaiscript *)&local_70,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int
              **)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"erase_at",&local_71);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_70,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void sequence_type(const std::string & /*type*/, Module &m) {
    m.add(fun(&detail::insert_at<ContainerType>), []() -> std::string {
      if (typeid(typename ContainerType::value_type) == typeid(Boxed_Value)) {
        return "insert_ref_at";
      } else {
        return "insert_at";
      }
    }());

    m.add(fun(&detail::erase_at<ContainerType>), "erase_at");
  }